

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanohttp.cpp
# Opt level: O3

string * HTTP::URLEncode(string *__return_storage_ptr__,string *raw)

{
  long *plVar1;
  byte bVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong uVar5;
  char buf [3];
  char local_9b [2];
  undefined1 local_99;
  long *local_98;
  undefined8 local_90;
  long local_88;
  undefined8 uStack_80;
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (raw->_M_string_length != 0) {
    uVar5 = 0;
    do {
      bVar2 = (raw->_M_dataplus)._M_p[uVar5];
      if (((byte)(bVar2 - 0x30) < 10) || ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        snprintf(local_9b,3,"%02x");
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"%","");
        local_78 = local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,local_9b,&local_99);
        uVar4 = 0xf;
        if (local_50 != local_40) {
          uVar4 = local_40[0];
        }
        if (uVar4 < (ulong)(local_70 + local_48)) {
          uVar4 = 0xf;
          if (local_78 != local_68) {
            uVar4 = local_68[0];
          }
          if (uVar4 < (ulong)(local_70 + local_48)) goto LAB_00178eaa;
          puVar3 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_50);
        }
        else {
LAB_00178eaa:
          puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_78);
        }
        plVar1 = puVar3 + 2;
        if ((long *)*puVar3 == plVar1) {
          local_88 = *plVar1;
          uStack_80 = puVar3[3];
          local_98 = &local_88;
        }
        else {
          local_88 = *plVar1;
          local_98 = (long *)*puVar3;
        }
        local_90 = puVar3[1];
        *puVar3 = plVar1;
        puVar3[1] = 0;
        *(undefined1 *)plVar1 = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98);
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88 + 1);
        }
        if (local_78 != local_68) {
          operator_delete(local_78,local_68[0] + 1);
        }
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < raw->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HTTP::URLEncode(std::string raw)
{
	std::string encoded;
	char buf[3];

	for (size_t i = 0; i < raw.length(); ++i)
	{
		char c = raw[i];

		if ((c >= 'a' && c <= 'z') || (c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9'))
		{
			encoded += c;
		}
		else
		{
			using namespace std;
			snprintf(buf, 3, "%02x", c);
			encoded += std::string("%") + std::string(buf, 2);
		}
	}

	return encoded;
}